

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_case.cpp
# Opt level: O0

UBool uhash_compareCaselessUnicodeString_63(UElement key1,UElement key2)

{
  int8_t iVar1;
  UnicodeString *str2;
  UnicodeString *str1;
  UElement key2_local;
  UElement key1_local;
  
  if (key1.pointer == key2.pointer) {
    key1_local._7_1_ = 1;
  }
  else if ((key1.pointer == (void *)0x0) || (key2.pointer == (void *)0x0)) {
    key1_local._7_1_ = 0;
  }
  else {
    iVar1 = icu_63::UnicodeString::caseCompare
                      ((UnicodeString *)key1.pointer,(UnicodeString *)key2.pointer,0);
    key1_local._7_1_ = iVar1 == '\0';
  }
  return key1_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareCaselessUnicodeString(const UElement key1, const UElement key2) {
    U_NAMESPACE_USE
    const UnicodeString *str1 = (const UnicodeString*) key1.pointer;
    const UnicodeString *str2 = (const UnicodeString*) key2.pointer;
    if (str1 == str2) {
        return TRUE;
    }
    if (str1 == NULL || str2 == NULL) {
        return FALSE;
    }
    return str1->caseCompare(*str2, U_FOLD_CASE_DEFAULT) == 0;
}